

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

int Gia_ManBmcPerform_Unr(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  Vec_Int_t *p_00;
  Bmc_Mna_t *p_01;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Gia_Man_t *pGVar9;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  abctime aVar12;
  char *pcVar13;
  double dVar14;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar15;
  int local_4c;
  Gia_Obj_t *pObj;
  int RetValue;
  int status;
  int Lit;
  int i;
  int f;
  int nFramesMax;
  Bmc_Mna_t *p;
  Unr_Man_t *pUnroll;
  Bmc_AndPar_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  if (pPars->nFramesMax == 0) {
    local_4c = 1000000000;
  }
  else {
    local_4c = pPars->nFramesMax;
  }
  i = local_4c;
  status = 0;
  pObj._0_4_ = -2;
  pUnroll = (Unr_Man_t *)pPars;
  pPars_local = (Bmc_AndPar_t *)pGia;
  _f = Bmc_MnaAlloc();
  p = (Bmc_Mna_t *)Unr_ManUnrollStart((Gia_Man_t *)pPars_local,*(int *)&pUnroll->pObjs);
  Lit = 0;
  do {
    if (i <= Lit) {
LAB_006bb79c:
      if ((int)pObj == -2) {
        pObj._0_4_ = -1;
      }
      if (*(int *)&pUnroll->vOrderLim != 0) {
        pGVar9 = Gia_ManCleanup(_f->pFrames);
        _f->pFrames = pGVar9;
        Gia_AigerWrite(_f->pFrames,"frames.aig",0,0,0);
        printf("Dumped unfolded frames into file \"frames.aig\".\n");
        Gia_ManStop(_f->pFrames);
      }
      Unr_ManFree((Unr_Man_t *)p);
      Bmc_MnaFree(_f);
      return (int)pObj;
    }
    pGVar9 = Unr_ManUnrollFrame((Unr_Man_t *)p,Lit);
    iVar4 = Lit;
    _f->pFrames = pGVar9;
    pGVar9 = _f->pFrames;
    iVar1 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
    iVar2 = Lit + 1;
    iVar3 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
    iVar1 = Gia_ManBmcCheckOutputs(pGVar9,iVar4 * iVar1,iVar2 * iVar3);
    p_01 = _f;
    iVar4 = Lit;
    if (iVar1 == 0) {
      iVar1 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
      iVar2 = Lit + 1;
      iVar3 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
      Gia_ManBmcAddCone(p_01,iVar4 * iVar1,iVar2 * iVar3);
      Gia_ManBmcAddCnf(_f,_f->pFrames,_f->vInputs,_f->vNodes,_f->vOutputs);
      iVar4 = Lit;
      iVar1 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
      for (status = iVar4 * iVar1; iVar4 = status, iVar1 = Lit + 1,
          iVar2 = Gia_ManPoNum((Gia_Man_t *)pPars_local), iVar4 < iVar1 * iVar2; status = status + 1
          ) {
        pObj_00 = Gia_ManPo(_f->pFrames,status);
        pGVar10 = Gia_ObjChild0(pObj_00);
        pGVar11 = Gia_ManConst0(_f->pFrames);
        if (pGVar10 != pGVar11) {
          p_00 = _f->vId2Var;
          iVar4 = Gia_ObjId(_f->pFrames,pObj_00);
          iVar4 = Vec_IntEntry(p_00,iVar4);
          RetValue = Abc_Var2Lit(iVar4,0);
          in_stack_ffffffffffffff28 = 0;
          iVar4 = sat_solver_solve(_f->pSat,&RetValue,&status,
                                   (long)*(int *)((long)&pUnroll->pFrames + 4),0,0,0);
          if (iVar4 != -1) {
            if (iVar4 == 1) {
              pObj._0_4_ = 0;
            }
            if (iVar4 == 0) {
              pObj._0_4_ = -1;
            }
            break;
          }
        }
      }
    }
    iVar4 = Lit;
    uVar15 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    if (*(int *)((long)&pUnroll->vRanks + 4) != 0) {
      uVar5 = Gia_ManPiNum(_f->pFrames);
      uVar6 = Gia_ManAndNum(_f->pFrames);
      iVar1 = _f->nSatVars;
      uVar7 = Vec_IntSize(_f->vInputs);
      iVar2 = Vec_IntSize(_f->vNodes);
      iVar3 = sat_solver_nclauses(_f->pSat);
      iVar8 = sat_solver_nconflicts(_f->pSat);
      dVar14 = Gia_ManMemory(_f->pFrames);
      in_stack_ffffffffffffff28 = CONCAT44(uVar15,iVar2);
      printf("%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   "
             ,dVar14 / 1048576.0,(ulong)(uint)iVar4,(ulong)uVar5,(ulong)uVar6,(ulong)(iVar1 - 1),
             (ulong)uVar7,in_stack_ffffffffffffff28,iVar3,iVar8);
      aVar12 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar12 - _f->clkStart);
    }
    iVar1 = Lit;
    iVar4 = status;
    if ((int)pObj != -2) {
      if ((int)pObj == -1) {
        printf("SAT solver reached conflict/runtime limit in frame %d.\n",(ulong)(uint)Lit);
      }
      else {
        iVar2 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
        pcVar13 = Gia_ManName((Gia_Man_t *)pPars_local);
        printf("Output %d of miter \"%s\" was asserted in frame %d.  ",
               (ulong)(uint)(iVar4 - iVar1 * iVar2),pcVar13,(ulong)(uint)Lit);
        aVar12 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar12 - _f->clkStart);
      }
      goto LAB_006bb79c;
    }
    Lit = Lit + 1;
  } while( true );
}

Assistant:

int Gia_ManBmcPerform_Unr( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Unr_Man_t * pUnroll;
    Bmc_Mna_t * p;
    int nFramesMax = pPars->nFramesMax ? pPars->nFramesMax : ABC_INFINITY;
    int f, i=0, Lit, status, RetValue = -2;
    p = Bmc_MnaAlloc();
    pUnroll = Unr_ManUnrollStart( pGia, pPars->fVeryVerbose );
    for ( f = 0; f < nFramesMax; f++ )
    {
        p->pFrames = Unr_ManUnrollFrame( pUnroll, f );
        if ( !Gia_ManBmcCheckOutputs( p->pFrames, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) ) )
        {
            // create another slice
            Gia_ManBmcAddCone( p, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) );
            // create CNF in the SAT solver
            Gia_ManBmcAddCnf( p, p->pFrames, p->vInputs, p->vNodes, p->vOutputs );
            // try solving the outputs
            for ( i = f * Gia_ManPoNum(pGia); i < (f+1) * Gia_ManPoNum(pGia); i++ )
            {
                Gia_Obj_t * pObj = Gia_ManPo(p->pFrames, i);
                if ( Gia_ObjChild0(pObj) == Gia_ManConst0(p->pFrames) )
                    continue;
                Lit = Abc_Var2Lit( Vec_IntEntry(p->vId2Var, Gia_ObjId(p->pFrames, pObj)), 0 );
                status = sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( status == l_False ) // unsat
                    continue;
                if ( status == l_True ) // sat
                    RetValue = 0;
                if ( status == l_Undef ) // undecided
                    RetValue = -1;
                break;
            }
        }
        // report statistics
        if ( pPars->fVerbose )
        {
            printf( "%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   ", 
                f, Gia_ManPiNum(p->pFrames), Gia_ManAndNum(p->pFrames), 
                p->nSatVars-1, Vec_IntSize(p->vInputs), Vec_IntSize(p->vNodes), 
                sat_solver_nclauses(p->pSat), sat_solver_nconflicts(p->pSat), Gia_ManMemory(p->pFrames)/(1<<20) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
        }
        if ( RetValue != -2 )
        {
            if ( RetValue == -1 )
                printf( "SAT solver reached conflict/runtime limit in frame %d.\n", f );
            else
            {
                printf( "Output %d of miter \"%s\" was asserted in frame %d.  ", 
                    i - f * Gia_ManPoNum(pGia), Gia_ManName(pGia), f );
                Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
            }
            break;
        }
    }
    if ( RetValue == -2 )
        RetValue = -1;
    // dump unfolded frames
    if ( pPars->fDumpFrames )
    {
        p->pFrames = Gia_ManCleanup( p->pFrames );
        Gia_AigerWrite( p->pFrames, "frames.aig", 0, 0, 0 );
        printf( "Dumped unfolded frames into file \"frames.aig\".\n" );
        Gia_ManStop( p->pFrames );
    }
    // cleanup
    Unr_ManFree( pUnroll );
    Bmc_MnaFree( p );
    return RetValue;
}